

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3BtreeSchema(Btree *p,int nBytes,_func_void_void_ptr *xFree)

{
  BtShared *pBVar1;
  void *pvVar2;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  if ((nBytes != 0) && (pBVar1->pSchema == (void *)0x0)) {
    pvVar2 = sqlite3DbMallocZero((sqlite3 *)0x0,(ulong)(uint)nBytes);
    pBVar1->pSchema = pvVar2;
    pBVar1->xFreeSchema = xFree;
  }
  sqlite3BtreeLeave(p);
  return pBVar1->pSchema;
}

Assistant:

SQLITE_PRIVATE void *sqlite3BtreeSchema(Btree *p, int nBytes, void(*xFree)(void *)){
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if( !pBt->pSchema && nBytes ){
    pBt->pSchema = sqlite3DbMallocZero(0, nBytes);
    pBt->xFreeSchema = xFree;
  }
  sqlite3BtreeLeave(p);
  return pBt->pSchema;
}